

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O1

int Fxch_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nMaxDivExt,int fVerbose,int fVeryVerbose)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  Vec_Que_t *pVVar5;
  int *piVar6;
  int *piVar7;
  float *pfVar8;
  Vec_Int_t *pVVar9;
  void *__ptr;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  Fxch_Man_t *pFxchMan;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  Fxch_Man_t *pFVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  timespec ts;
  timespec local_50;
  int local_40;
  int local_3c;
  long local_38;
  
  local_40 = fVerbose;
  local_3c = nMaxDivExt;
  pFxchMan = Fxch_ManAlloc(vCubes);
  iVar12 = clock_gettime(3,&local_50);
  if (iVar12 < 0) {
    lVar15 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar15 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  Fxch_CubesGruping(pFxchMan);
  Fxch_ManMapLiteralsIntoCubes(pFxchMan,ObjIdMax);
  Fxch_ManGenerateLitHashKeys(pFxchMan);
  Fxch_ManComputeLevel(pFxchMan);
  Fxch_ManSCHashTablesInit(pFxchMan);
  Fxch_ManDivCreate(pFxchMan);
  iVar12 = clock_gettime(3,&local_50);
  if (iVar12 < 0) {
    lVar16 = -1;
  }
  else {
    lVar16 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pFxchMan->timeInit = lVar16 + lVar15;
  if (fVeryVerbose != 0) {
    Fxch_ManPrintDivs(pFxchMan);
  }
  if (local_40 != 0) {
    Fxch_ManPrintStats(pFxchMan);
  }
  iVar12 = clock_gettime(3,&local_50);
  if (iVar12 < 0) {
    local_38 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_38 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (-1 < local_3c) {
    iVar12 = 0;
    do {
      pVVar5 = pFxchMan->vDivPrio;
      iVar3 = pVVar5->nSize;
      if (iVar3 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      fVar23 = -1e+09;
      if (iVar3 != 1) {
        if (*pVVar5->pCostsFlt == (float *)0x0) {
          fVar23 = (float)pVVar5->pHeap[1];
        }
        else {
          fVar23 = (*pVVar5->pCostsFlt)[pVVar5->pHeap[1]];
        }
      }
      if (fVar23 <= 0.0) break;
      if (iVar3 == 1) {
        __assert_fail("p->nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0xed,"int Vec_QuePop(Vec_Que_t *)");
      }
      piVar6 = pVVar5->pHeap;
      piVar7 = pVVar5->pOrder;
      iVar3 = piVar6[1];
      piVar7[iVar3] = -1;
      iVar19 = pVVar5->nSize;
      pVVar5->nSize = iVar19 + -1;
      if (iVar19 + -1 == 1) {
        piVar6[1] = -1;
      }
      else {
        iVar4 = piVar6[(long)iVar19 + -1];
        piVar6[(long)iVar19 + -1] = -1;
        piVar6[1] = iVar4;
        piVar7[iVar4] = 1;
        pfVar8 = *pVVar5->pCostsFlt;
        if (pfVar8 == (float *)0x0) {
          fVar23 = (float)iVar4;
        }
        else {
          fVar23 = pfVar8[iVar4];
        }
        iVar19 = pVVar5->nSize;
        uVar17 = 1;
        if (2 < iVar19) {
          uVar13 = 2;
          uVar17 = 1;
          do {
            uVar20 = uVar13 | 1;
            uVar21 = uVar13;
            if ((int)uVar20 < iVar19) {
              if (pfVar8 == (float *)0x0) {
                fVar24 = (float)piVar6[(int)uVar13];
              }
              else {
                fVar24 = pfVar8[piVar6[(int)uVar13]];
              }
              if (pfVar8 == (float *)0x0) {
                fVar25 = (float)piVar6[(int)uVar20];
              }
              else {
                fVar25 = pfVar8[piVar6[(int)uVar20]];
              }
              if (fVar24 < fVar25) {
                uVar21 = uVar20;
              }
            }
            if (iVar19 <= (int)uVar21) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar19 = piVar6[(int)uVar21];
            if (pfVar8 == (float *)0x0) {
              fVar24 = (float)iVar19;
            }
            else {
              fVar24 = pfVar8[iVar19];
            }
            if (fVar24 <= fVar23) break;
            piVar6[(int)uVar17] = iVar19;
            piVar7[iVar19] = uVar17;
            uVar13 = uVar21 * 2;
            iVar19 = pVVar5->nSize;
            uVar17 = uVar21;
          } while ((int)uVar13 < iVar19);
        }
        piVar6[(int)uVar17] = iVar4;
        piVar7[iVar4] = uVar17;
      }
      if (fVeryVerbose != 0) {
        Fxch_DivPrint(pFxchMan,iVar3);
      }
      iVar19 = local_3c;
      bVar22 = local_3c == 0;
      Fxch_ManUpdate(pFxchMan,iVar3);
      iVar12 = iVar12 + 1;
    } while (iVar12 < iVar19 || bVar22);
  }
  iVar12 = clock_gettime(3,&local_50);
  if (iVar12 < 0) {
    lVar15 = -1;
  }
  else {
    lVar15 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  pFxchMan->timeExt = lVar15 + local_38;
  if (local_40 != 0) {
    pFVar18 = pFxchMan;
    Fxch_ManPrintStats(pFxchMan);
    lVar15 = pFxchMan->timeExt;
    lVar16 = pFxchMan->timeInit;
    iVar12 = (int)pFVar18;
    Abc_Print(iVar12,"%s =","\n[FXCH] Elapsed Time");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)(lVar15 + lVar16) / 1000000.0,0));
    lVar15 = pFxchMan->timeInit;
    Abc_Print(iVar12,"%s =","[FXCH]    +-> Init");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)lVar15 / 1000000.0,0));
    lVar15 = pFxchMan->timeExt;
    Abc_Print(iVar12,"%s =","[FXCH]    +-> Extr");
    Abc_Print(iVar12,"%9.2f sec\n",SUB84((double)lVar15 / 1000000.0,0));
  }
  Fxch_CubesUnGruping(pFxchMan);
  Fxch_ManSCHashTablesFree(pFxchMan);
  Fxch_ManFree(pFxchMan);
  if (vCubes->nSize < 1) {
    uVar17 = 0;
  }
  else {
    lVar15 = 0;
    lVar16 = 8;
    uVar17 = 0;
    do {
      pVVar9 = vCubes->pArray;
      if (*(int *)((long)pVVar9 + lVar16 + -4) < 1) {
        __ptr = *(void **)((long)&pVVar9->nCap + lVar16);
        if (__ptr != (void *)0x0) {
          free(__ptr);
          *(undefined8 *)((long)&pVVar9->nCap + lVar16) = 0;
        }
      }
      else {
        puVar1 = (undefined4 *)((long)&pVVar9->nCap + lVar16);
        lVar14 = (long)(int)uVar17;
        uVar17 = uVar17 + 1;
        iVar12 = puVar1[-1];
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        pVVar9 = pVVar9 + lVar14;
        pVVar9->nCap = puVar1[-2];
        pVVar9->nSize = iVar12;
        *(undefined4 *)&pVVar9->pArray = uVar10;
        *(undefined4 *)((long)&pVVar9->pArray + 4) = uVar11;
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar15 < vCubes->nSize);
  }
  iVar12 = vCubes->nSize;
  if ((int)uVar17 < iVar12) {
    if ((int)uVar17 < 0) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    lVar15 = (ulong)uVar17 << 4;
    uVar13 = uVar17;
    do {
      puVar2 = (undefined8 *)((long)&vCubes->pArray->nCap + lVar15);
      *puVar2 = 0;
      puVar2[1] = 0;
      iVar12 = vCubes->nSize;
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x10;
    } while ((int)uVar13 < iVar12);
  }
  if (iVar12 < (int)uVar17) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0xfa,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = uVar17;
  qsort(vCubes->pArray,(long)(int)uVar17,0x10,Vec_WecSortCompare3);
  return 1;
}

Assistant:

int Fxch_FastExtract( Vec_Wec_t* vCubes,
                      int ObjIdMax,
                      int nMaxDivExt,
                      int fVerbose,
                      int fVeryVerbose )
{
    abctime TempTime;
    Fxch_Man_t* pFxchMan = Fxch_ManAlloc( vCubes );
    int i;

    TempTime = Abc_Clock();
    Fxch_CubesGruping( pFxchMan );
    Fxch_ManMapLiteralsIntoCubes( pFxchMan, ObjIdMax );
    Fxch_ManGenerateLitHashKeys( pFxchMan );
    Fxch_ManComputeLevel( pFxchMan );
    Fxch_ManSCHashTablesInit( pFxchMan );
    Fxch_ManDivCreate( pFxchMan );
    pFxchMan->timeInit = Abc_Clock() - TempTime;

    if ( fVeryVerbose )
        Fxch_ManPrintDivs( pFxchMan );

    if ( fVerbose )
        Fxch_ManPrintStats( pFxchMan );

    TempTime = Abc_Clock();
    
    for ( i = 0; (!nMaxDivExt || i < nMaxDivExt) && Vec_QueTopPriority( pFxchMan->vDivPrio ) > 0.0; i++ )
    {
        int iDiv = Vec_QuePop( pFxchMan->vDivPrio );

        if ( fVeryVerbose )
            Fxch_DivPrint( pFxchMan, iDiv );

        Fxch_ManUpdate( pFxchMan, iDiv );
    }
   
    pFxchMan->timeExt = Abc_Clock() - TempTime;

    if ( fVerbose )
    {
        Fxch_ManPrintStats( pFxchMan );
        Abc_PrintTime( 1, "\n[FXCH] Elapsed Time", pFxchMan->timeInit + pFxchMan->timeExt );
        Abc_PrintTime( 1, "[FXCH]    +-> Init", pFxchMan->timeInit );
        Abc_PrintTime( 1, "[FXCH]    +-> Extr", pFxchMan->timeExt );
    }

    Fxch_CubesUnGruping( pFxchMan );
    Fxch_ManSCHashTablesFree( pFxchMan );
    Fxch_ManFree( pFxchMan );

    Vec_WecRemoveEmpty( vCubes );
    Vec_WecSortByFirstInt( vCubes, 0 );

    return 1;
}